

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::DefaultPrintTo<std::vector<bool,std::allocator<bool>>>
               (undefined8 param_1,vector<bool,_std::allocator<bool>_> *param_2,ostream *param_3)

{
  bool bVar1;
  const_iterator cVar2;
  bool local_71;
  _Bit_type *local_70;
  uint local_68;
  _Bit_iterator_base local_60;
  _Bit_type *local_50;
  uint local_48;
  undefined1 local_40 [8];
  const_iterator it;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  vector<bool,_std::allocator<bool>_> *container_local;
  IsContainer param_0_local;
  
  std::operator<<(param_3,'{');
  it.super__Bit_iterator_base._M_offset = 0;
  it.super__Bit_iterator_base._12_4_ = 0;
  cVar2 = std::vector<bool,_std::allocator<bool>_>::begin(param_2);
  local_50 = cVar2.super__Bit_iterator_base._M_p;
  local_48 = cVar2.super__Bit_iterator_base._M_offset;
  local_40 = (undefined1  [8])local_50;
  it.super__Bit_iterator_base._M_p._0_4_ = local_48;
  do {
    cVar2 = std::vector<bool,_std::allocator<bool>_>::end(param_2);
    local_70 = cVar2.super__Bit_iterator_base._M_p;
    local_68 = cVar2.super__Bit_iterator_base._M_offset;
    local_60._M_p = local_70;
    local_60._M_offset = local_68;
    bVar1 = std::operator!=((_Bit_iterator_base *)local_40,&local_60);
    if (!bVar1) {
LAB_00151153:
      if (it.super__Bit_iterator_base._8_8_ != 0) {
        std::operator<<(param_3,' ');
      }
      std::operator<<(param_3,'}');
      return;
    }
    if ((it.super__Bit_iterator_base._8_8_ != 0) &&
       (std::operator<<(param_3,','), it.super__Bit_iterator_base._8_8_ == 0x20)) {
      std::operator<<(param_3," ...");
      goto LAB_00151153;
    }
    std::operator<<(param_3,' ');
    local_71 = std::_Bit_const_iterator::operator*((_Bit_const_iterator *)local_40);
    UniversalPrint<bool>(&local_71,param_3);
    std::_Bit_const_iterator::operator++((_Bit_const_iterator *)local_40);
    it.super__Bit_iterator_base._8_8_ = it.super__Bit_iterator_base._8_8_ + 1;
  } while( true );
}

Assistant:

void DefaultPrintTo(IsContainer /* dummy */,
                    false_type /* is not a pointer */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}